

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator==
               (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
                *c1,Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
                    *c2)

{
  bool bVar1;
  
  if (c1 != c2) {
    bVar1 = boost::intrusive::operator==(&(c1->column_).super_type,&(c2->column_).super_type);
    return bVar1;
  }
  return true;
}

Assistant:

bool operator==(const Intrusive_list_column& c1, const Intrusive_list_column& c2) {
    if (&c1 == &c2) return true;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ == c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      if (c1.column_.size() != c2.column_.size()) return false;
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index() || it1->get_element() != it2->get_element()) return false;
        ++it1;
        ++it2;
      }
      return true;
    }
  }